

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O0

void bfgs_naive(double *H,int N,double eps,double *xi,double *xf,double *jac,double *jacf)

{
  bool bVar1;
  double *C;
  double *C_00;
  double *C_01;
  double *C_02;
  double *B;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double *t;
  double *temp2;
  double *temp;
  double *yk;
  double *sk;
  double jacm;
  double yt;
  double fd;
  double yn;
  double sn;
  int ct;
  int supd;
  int j;
  int i;
  double *jacf_local;
  double *jac_local;
  double *xf_local;
  double *xi_local;
  double eps_local;
  int N_local;
  double *H_local;
  
  C = (double *)malloc((long)N << 3);
  C_00 = (double *)malloc((long)N << 3);
  C_01 = (double *)malloc(8);
  C_02 = (double *)malloc(8);
  B = (double *)malloc((long)N << 3);
  msub(xf,xi,C,1,N);
  msub(jacf,jac,C_00,1,N);
  dVar3 = l2norm(C,N);
  dVar4 = l2norm(C_00,N);
  dVar5 = sqrt(eps);
  mmult(C_00,C,C_01,1,N,1);
  if (dVar5 * dVar3 * dVar4 <= *C_01) {
    bVar1 = true;
    for (supd = 0; supd < N; supd = supd + 1) {
      B[supd] = 0.0;
      for (ct = 0; ct < supd; ct = ct + 1) {
        B[supd] = H[ct * N + supd] * C[ct] + B[supd];
      }
      for (ct = supd; ct < N; ct = ct + 1) {
        B[supd] = H[supd * N + ct] * C[ct] + B[supd];
      }
      if (jac[supd] < jacf[supd] || jac[supd] == jacf[supd]) {
        sk = (double *)jacf[supd];
      }
      else {
        sk = (double *)jac[supd];
      }
      if (dVar5 * (double)sk <= ABS(C_00[supd] - B[supd])) {
        bVar1 = false;
      }
    }
    if (!bVar1) {
      mmult(C,B,C_02,1,N,1);
      for (supd = 0; supd < N; supd = supd + 1) {
        for (ct = supd; ct < N; ct = ct + 1) {
          iVar2 = supd * N + ct;
          H[iVar2] = (C_00[supd] * C_00[ct]) / *C_01 + H[iVar2];
          iVar2 = supd * N + ct;
          H[iVar2] = H[iVar2] - (B[supd] * B[ct]) / *C_02;
        }
      }
    }
  }
  free(C);
  free(C_00);
  free(C_01);
  free(C_02);
  free(B);
  return;
}

Assistant:

void bfgs_naive(double *H,int N,double eps,double *xi,double *xf,double *jac,double *jacf) {
	int i,j,supd,ct;
	double sn,yn,fd,yt,jacm;
	double *sk,*yk,*temp,*temp2,*t;
	
	sk = (double*) malloc(sizeof(double) *N);
	yk = (double*) malloc(sizeof(double) *N);
	temp = (double*) malloc(sizeof(double) *1);
	temp2 = (double*) malloc(sizeof(double) *1);
	t = (double*) malloc(sizeof(double) *N);
	
	msub(xf,xi,sk,1,N);
	msub(jacf,jac,yk,1,N);
	
	sn = l2norm(sk,N);
	yn = l2norm(yk,N);
	fd = sqrt(eps);
	
	mmult(yk,sk,temp,1,N,1);
	
	if (temp[0] >= fd*sn*yn) {
		supd = 1;
		for(i = 0; i < N;++i) {
			t[i] = 0.0;
			for(j = 0; j < i;++j) {
				ct = j * N;
				t[i] += H[ct+i] * sk[j];
			}
			
			for(j = i; j < N;++j) {
				ct = i * N;
				t[i] += H[ct + j] * sk[j];
			}
			yt = fabs(yk[i] - t[i]);
			if (jac[i] > jacf[i]) {
				jacm = jac[i];
			} else {
				jacm = jacf[i];
			}
			if (yt >= fd * jacm) {
				supd = 0;
			}
		}
		if (supd == 0) {
			mmult(sk,t,temp2,1,N,1);
			for(i = 0;i < N; ++i) {
				ct = i * N;
				for(j = i; j < N;++j) {
					H[ct+j] += (yk[i]*yk[j]/temp[0]);
					H[ct+j] -= (t[i]*t[j]/temp2[0]);
				}
			}
		} 
	} 
	
	free(sk);
	free(yk);
	free(temp);
	free(temp2);
	free(t);
}